

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.cpp
# Opt level: O3

String __thiscall MiniScript::Value::ToString(Value *this,Machine *vm)

{
  long *plVar1;
  size_t sVar2;
  StringStorage *pSVar3;
  char *pcVar4;
  StringStorage *pSVar5;
  undefined8 *puVar6;
  undefined4 *puVar7;
  undefined8 uVar8;
  long lVar9;
  StringStorage *pSVar10;
  StringStorage *pSVar11;
  char *pcVar12;
  _func_int **pp_Var13;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  undefined1 *puVar14;
  String *other;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  size_t sVar18;
  size_t sVar19;
  double dVar20;
  String SVar21;
  String s;
  String local_b0;
  StringStorage *local_a0;
  String local_98;
  StringStorage *local_88;
  undefined8 uStack_80;
  StringStorage *local_78;
  size_t local_70;
  long *local_68;
  anon_union_8_3_2f476f46_for_data local_60;
  ulong local_58;
  long local_50;
  StringStorage *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  StringStorage *local_38;
  
  local_a0 = (StringStorage *)this;
  switch(*(undefined1 *)&vm->standardOutput) {
  case 1:
    local_88 = *(StringStorage **)&vm->storeImplicit;
    uStack_80 = 0;
    dVar20 = fmod((double)local_88,1.0);
    if ((((dVar20 == 0.0) && (!NAN(dVar20))) || (10000000000.0 < ABS((double)local_88))) ||
       (ABS((double)local_88) < 1e-06)) {
      SVar21 = String::Format((double)local_88,(char *)this);
      in_RDX = SVar21._8_8_;
      goto LAB_00184cf6;
    }
    String::Format((double)local_88,(char *)this);
    lVar9 = *(long *)this;
    if (lVar9 == 0) {
      in_RDX = 0;
    }
    else {
      in_RDX = *(long *)(lVar9 + 0x18) - 1;
    }
    lVar15 = 1;
    if ((long)(in_RDX - 1) < 1) {
      lVar15 = in_RDX - 1;
    }
    while (uVar17 = in_RDX, in_RDX = uVar17 - 1, 1 < (long)in_RDX) {
      if ((*(char *)(*(long *)(lVar9 + 0x10) + -1 + uVar17) != '0') ||
         (*(char *)(*(long *)(lVar9 + 0x10) + -2 + uVar17) == '.')) goto LAB_00184d48;
    }
    uVar17 = lVar15 + 1;
    if (lVar9 == 0) goto LAB_00184cf6;
LAB_00184d48:
    if (*(long *)(lVar9 + 0x18) - 1U <= uVar17) goto LAB_00184cf6;
    String::SubstringB(&local_b0,(long)this,0);
    String::operator=((String *)this,&local_b0);
    in_RDX = extraout_RDX_11;
    break;
  case 2:
    pSVar10 = (StringStorage *)operator_new(0x30);
    (pSVar10->super_RefCountedStorage).refCount = 1;
    (pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar10->dataSize = 2;
    pSVar10->charCount = -1;
    pcVar4 = (char *)operator_new__(2);
    pSVar10->data = pcVar4;
    pcVar4[0] = '_';
    pcVar4[1] = '\0';
    SVar21 = String::Format(&local_b0,*(int *)&vm->storeImplicit,"%d");
    pSVar3 = local_b0.ss;
    in_RDX = SVar21._8_8_;
    if (local_b0.ss != (StringStorage *)0x0) {
      sVar18 = pSVar10->dataSize;
      pSVar5 = (StringStorage *)(local_b0.ss)->dataSize;
      pSVar11 = (StringStorage *)operator_new(0x30);
      uVar17 = (long)pSVar5 + (sVar18 - 1);
      (pSVar11->super_RefCountedStorage).refCount = 1;
      (pSVar11->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001bf0d8;
      pSVar11->dataSize = uVar17;
      pSVar11->charCount = -1;
      local_88 = pSVar5;
      pcVar4 = (char *)operator_new__(uVar17);
      sVar16 = sVar18 - 1;
      pSVar11->data = pcVar4;
      memset(pcVar4,0,uVar17);
      memcpy(pcVar4,pSVar10->data,sVar16);
      memcpy(pcVar4 + sVar16,pSVar3->data,(size_t)local_88);
      this = (Value *)local_a0;
      (local_a0->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)pSVar11;
      *(bool *)&(local_a0->super_RefCountedStorage).refCount = false;
      in_RDX = extraout_RDX;
      if (local_b0.isTemp == false) {
        plVar1 = &(pSVar3->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar3);
          in_RDX = extraout_RDX_00;
        }
      }
      goto LAB_00184a9c;
    }
    *(bool *)&(local_a0->super_RefCountedStorage).refCount = false;
    (local_a0->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)pSVar10;
LAB_00184ab2:
    lVar9 = (pSVar10->super_RefCountedStorage).refCount;
    (pSVar10->super_RefCountedStorage).refCount = lVar9 + 1;
    this = (Value *)local_a0;
    goto LAB_00184abe;
  case 3:
    if (*(long *)&vm->storeImplicit == 0) {
      uVar8 = 0;
    }
    else {
      plVar1 = (long *)(*(long *)&vm->storeImplicit + 8);
      *plVar1 = *plVar1 + 1;
      uVar8 = *(undefined8 *)&vm->storeImplicit;
    }
    this->type = (char)uVar8;
    this->noInvoke = (bool)(char)((ulong)uVar8 >> 8);
    this->localOnly = (char)((ulong)uVar8 >> 0x10);
    *(int5 *)&this->field_0x3 = (int5)((ulong)uVar8 >> 0x18);
    goto LAB_00184959;
  case 4:
  case 5:
    SVar21 = CodeForm(this,vm,(int)in_RDX);
    in_RDX = SVar21._8_8_;
    goto LAB_00184cf6;
  case 6:
    local_b0.isTemp = false;
    local_58 = in_RDX;
    pSVar10 = (StringStorage *)operator_new(0x30);
    (pSVar10->super_RefCountedStorage).refCount = 1;
    (pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar10->dataSize = 10;
    pSVar10->charCount = -1;
    pcVar4 = (char *)operator_new__(10);
    pSVar10->data = pcVar4;
    builtin_strncpy(pcVar4,"FUNCTION(",10);
    local_88 = *(StringStorage **)&vm->storeImplicit;
    local_50 = 0;
    sVar18 = 0;
    local_b0.ss = pSVar10;
    while( true ) {
      pcVar4 = local_88->data;
      if (pcVar4 == (char *)0x0) {
        lVar9 = 0;
      }
      else {
        lVar9 = *(long *)(pcVar4 + 0x20);
      }
      if (lVar9 <= (long)sVar18) break;
      if (sVar18 != 0) {
        local_98.isTemp = false;
        pSVar3 = (StringStorage *)operator_new(0x30);
        (pSVar3->super_RefCountedStorage).refCount = 1;
        (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__StringStorage_001bf0d8;
        pSVar3->dataSize = 3;
        pSVar3->charCount = -1;
        pcVar4 = (char *)operator_new__(3);
        pSVar10 = local_b0.ss;
        pSVar3->data = pcVar4;
        pcVar4[2] = '\0';
        pcVar4[0] = ',';
        pcVar4[1] = ' ';
        local_98.ss = pSVar3;
        if (local_b0.ss == (StringStorage *)0x0) {
          String::operator=(&local_b0,&local_98);
        }
        else {
          sVar2 = (local_b0.ss)->dataSize;
          pSVar3 = (StringStorage *)operator_new(0x30);
          uVar17 = sVar2 + 2;
          (pSVar3->super_RefCountedStorage).refCount = 1;
          (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001bf0d8;
          pSVar3->dataSize = uVar17;
          pSVar3->charCount = -1;
          pcVar4 = (char *)operator_new__(uVar17);
          local_78 = (StringStorage *)(sVar2 - 1);
          pSVar3->data = pcVar4;
          memset(pcVar4,0,uVar17);
          memcpy(pcVar4,pSVar10->data,(size_t)local_78);
          (pcVar4 + (sVar2 - 1))[0] = ',';
          (pcVar4 + (sVar2 - 1))[1] = ' ';
          pcVar4[sVar2 + 1] = '\0';
          if (local_b0.isTemp == false) {
            plVar1 = &(pSVar10->super_RefCountedStorage).refCount;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (*(pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar10);
            }
          }
          local_b0.isTemp = false;
          local_b0.ss = pSVar3;
        }
        if ((local_98.ss != (StringStorage *)0x0) && (local_98.isTemp == false)) {
          plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_98.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
        }
        pcVar4 = local_88->data;
        this = (Value *)local_a0;
      }
      if (pcVar4 == (char *)0x0) {
        _Error("Assert failed: ls",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
               ,0x3b);
        pcVar4 = local_88->data;
      }
      if ((long)sVar18 < *(long *)(pcVar4 + 0x20)) {
        other = (String *)(*(long *)(pcVar4 + 0x18) + local_50);
      }
      else {
        _Error("invalid index in SimpleVector::operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
               ,0xc1);
        other = *(String **)(pcVar4 + 0x18);
      }
      pSVar10 = other->ss;
      local_70 = sVar18;
      if (pSVar10 != (StringStorage *)0x0) {
        if (local_b0.ss == (StringStorage *)0x0) {
          String::operator=(&local_b0,other);
        }
        else {
          local_78 = local_b0.ss;
          sVar18 = (local_b0.ss)->dataSize;
          sVar16 = pSVar10->dataSize;
          pSVar5 = (StringStorage *)operator_new(0x30);
          uVar17 = (sVar18 + sVar16) - 1;
          (pSVar5->super_RefCountedStorage).refCount = 1;
          (pSVar5->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001bf0d8;
          pSVar5->dataSize = uVar17;
          pSVar5->charCount = -1;
          pcVar4 = (char *)operator_new__(uVar17);
          sVar19 = sVar18 - 1;
          pSVar5->data = pcVar4;
          memset(pcVar4,0,uVar17);
          pSVar3 = local_78;
          memcpy(pcVar4,local_78->data,sVar19);
          memcpy(pcVar4 + sVar19,pSVar10->data,sVar16);
          if (local_b0.isTemp == false) {
            plVar1 = &(pSVar3->super_RefCountedStorage).refCount;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (*(pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
            }
          }
          local_b0.isTemp = false;
          this = (Value *)local_a0;
          sVar18 = local_70;
          local_b0.ss = pSVar5;
        }
      }
      pcVar4 = local_88->data;
      if (pcVar4 == (char *)0x0) {
        _Error("Assert failed: ls",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
               ,0x3b);
        pcVar4 = local_88->data;
      }
      if ((long)sVar18 < *(long *)(pcVar4 + 0x20)) {
        lVar9 = *(long *)(pcVar4 + 0x18) + local_50;
      }
      else {
        _Error("invalid index in SimpleVector::operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
               ,0xc1);
        lVar9 = *(long *)(pcVar4 + 0x18);
      }
      if (*(char *)(lVar9 + 0x10) != '\0') {
        pSVar10 = (StringStorage *)operator_new(0x30);
        (pSVar10->super_RefCountedStorage).refCount = 1;
        (pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__StringStorage_001bf0d8;
        pSVar10->dataSize = 2;
        pSVar10->charCount = -1;
        pcVar4 = (char *)operator_new__(2);
        uVar17 = local_58;
        pSVar10->data = pcVar4;
        pcVar4[0] = '=';
        pcVar4[1] = '\0';
        pcVar4 = local_88->data;
        local_78 = pSVar10;
        if (pcVar4 == (char *)0x0) {
          _Error("Assert failed: ls",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                 ,0x3b);
          pcVar4 = local_88->data;
        }
        if ((long)local_70 < *(long *)(pcVar4 + 0x20)) {
          lVar9 = *(long *)(pcVar4 + 0x18) + local_50;
        }
        else {
          _Error("invalid index in SimpleVector::operator[]",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                 ,0xc1);
          lVar9 = *(long *)(pcVar4 + 0x18);
        }
        CodeForm((Value *)&local_68,(Machine *)(lVar9 + 0x10),(int)uVar17);
        plVar1 = local_68;
        if (local_68 == (long *)0x0) {
          plVar1 = &(pSVar10->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + 1;
          pSVar3 = pSVar10;
        }
        else {
          sVar18 = pSVar10->dataSize;
          sVar16 = local_68[3];
          pSVar10 = (StringStorage *)operator_new(0x30);
          uVar17 = (sVar18 + sVar16) - 1;
          (pSVar10->super_RefCountedStorage).refCount = 1;
          (pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001bf0d8;
          pSVar10->dataSize = uVar17;
          pSVar10->charCount = -1;
          pcVar4 = (char *)operator_new__(uVar17);
          sVar19 = sVar18 - 1;
          pSVar10->data = pcVar4;
          memset(pcVar4,0,uVar17);
          pSVar3 = local_78;
          memcpy(pcVar4,local_78->data,sVar19);
          memcpy(pcVar4 + sVar19,(void *)plVar1[2],sVar16);
        }
        local_98.isTemp = false;
        local_98.ss = pSVar10;
        if (local_b0.ss == (StringStorage *)0x0) {
          String::operator=(&local_b0,&local_98);
        }
        else {
          local_38 = local_b0.ss;
          sVar18 = (local_b0.ss)->dataSize;
          sVar16 = pSVar10->dataSize;
          pSVar5 = (StringStorage *)operator_new(0x30);
          uVar17 = (sVar18 + sVar16) - 1;
          (pSVar5->super_RefCountedStorage).refCount = 1;
          (pSVar5->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001bf0d8;
          pSVar5->dataSize = uVar17;
          pSVar5->charCount = -1;
          pcVar4 = (char *)operator_new__(uVar17);
          sVar19 = sVar18 - 1;
          pSVar5->data = pcVar4;
          memset(pcVar4,0,uVar17);
          pSVar3 = local_38;
          memcpy(pcVar4,local_38->data,sVar19);
          memcpy(pcVar4 + sVar19,pSVar10->data,sVar16);
          if (local_b0.isTemp == false) {
            plVar1 = &(pSVar3->super_RefCountedStorage).refCount;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (*(pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar3);
            }
          }
          local_b0.isTemp = false;
          pSVar3 = local_78;
          local_b0.ss = pSVar5;
        }
        sVar18 = local_70;
        this = (Value *)local_a0;
        if ((local_98.ss != (StringStorage *)0x0) && (local_98.isTemp == false)) {
          plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_98.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_98.ss = (StringStorage *)0x0;
        }
        if ((local_68 != (long *)0x0) && (local_60.tempNum._0_1_ == '\0')) {
          plVar1 = local_68 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*local_68 + 8))();
          }
        }
        plVar1 = &(pSVar3->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar3);
        }
      }
      sVar18 = sVar18 + 1;
      local_50 = local_50 + 0x20;
    }
    SVar21 = String::operator+((String *)this,(char *)&local_b0);
    in_RDX = SVar21._8_8_;
    break;
  case 7:
    if (*(long *)&vm->storeImplicit == 0) {
      if (*(char *)((long)&vm->standardOutput + 1) == '\0') {
        *(undefined1 *)&this->data = 0;
        this->type = Null;
        this->noInvoke = false;
        this->localOnly = Off;
        *(undefined5 *)&this->field_0x3 = 0;
        goto LAB_00184cf6;
      }
      pSVar10 = (StringStorage *)0x0;
    }
    else {
      plVar1 = (long *)(*(long *)&vm->storeImplicit + 8);
      *plVar1 = *plVar1 + 1;
      pSVar10 = *(StringStorage **)&vm->storeImplicit;
      if (*(char *)((long)&vm->standardOutput + 1) == '\0') {
        *(undefined1 *)&this->data = 0;
        *(StringStorage **)this = pSVar10;
        if (pSVar10 == (StringStorage *)0x0) goto LAB_00184cf6;
        goto LAB_00184ab2;
      }
    }
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar3->dataSize = 2;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(2);
    pSVar3->data = pcVar4;
    pcVar4[0] = '@';
    pcVar4[1] = '\0';
    if (pSVar10 == (StringStorage *)0x0) {
      *(undefined1 *)&this->data = 0;
      *(StringStorage **)this = pSVar3;
      (pSVar3->super_RefCountedStorage).refCount = 1;
      in_RDX = extraout_RDX_02;
      goto LAB_00184cf6;
    }
    pSVar5 = (StringStorage *)pSVar10->dataSize;
    pSVar11 = (StringStorage *)operator_new(0x30);
    puVar14 = (undefined1 *)((long)&(pSVar5->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
    (pSVar11->super_RefCountedStorage).refCount = 1;
    (pSVar11->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar11->dataSize = (size_t)puVar14;
    pSVar11->charCount = -1;
    local_88 = pSVar5;
    pcVar12 = (char *)operator_new__((ulong)puVar14);
    pSVar11->data = pcVar12;
    memset(pcVar12,0,(size_t)puVar14);
    *pcVar12 = *pcVar4;
    memcpy(pcVar12 + 1,pSVar10->data,(size_t)local_88);
    this = (Value *)local_a0;
    (local_a0->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)pSVar11;
    *(bool *)&(local_a0->super_RefCountedStorage).refCount = false;
    (pSVar3->super_RefCountedStorage).refCount = 0;
    StringStorage::~StringStorage(pSVar3);
    in_RDX = extraout_RDX_03;
LAB_00184a9c:
    lVar9 = (pSVar10->super_RefCountedStorage).refCount + -1;
LAB_00184abe:
    (pSVar10->super_RefCountedStorage).refCount = lVar9;
    if (lVar9 != 0) goto LAB_00184cf6;
    pp_Var13 = (pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage;
    goto LAB_00184cf3;
  case 8:
    lVar9 = *(long *)&vm->storeImplicit;
    ToString((Value *)&local_68,(Machine *)(lVar9 + 0x10));
    String::operator+(&local_98,(char *)&local_68);
    ToString((Value *)&local_48,(Machine *)(lVar9 + 0x20));
    pSVar10 = local_48;
    if (local_48 == (StringStorage *)0x0) {
      local_b0.ss = local_98.ss;
      if (local_98.ss != (StringStorage *)0x0) {
        plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
    }
    else if (local_98.ss == (StringStorage *)0x0) {
      local_b0.ss = local_48;
      plVar1 = &(local_48->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
    }
    else {
      local_88 = local_98.ss;
      sVar18 = (local_98.ss)->dataSize;
      sVar2 = local_48->dataSize;
      pSVar3 = (StringStorage *)operator_new(0x30);
      uVar17 = (sVar2 + sVar18) - 1;
      (pSVar3->super_RefCountedStorage).refCount = 1;
      (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001bf0d8;
      pSVar3->dataSize = uVar17;
      pSVar3->charCount = -1;
      local_70 = sVar2;
      pcVar4 = (char *)operator_new__(uVar17);
      sVar16 = sVar18 - 1;
      pSVar3->data = pcVar4;
      memset(pcVar4,0,uVar17);
      memcpy(pcVar4,local_88->data,sVar16);
      memcpy(pcVar4 + sVar16,pSVar10->data,local_70);
      this = (Value *)local_a0;
      local_b0.ss = pSVar3;
    }
    local_b0.isTemp = false;
    SVar21 = String::operator+((String *)this,(char *)&local_b0);
    in_RDX = SVar21._8_8_;
    if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
      plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_04;
      }
      local_b0.ss = (StringStorage *)0x0;
    }
    if ((local_48 != (StringStorage *)0x0) && (local_40.tempNum._0_1_ == '\0')) {
      plVar1 = &(local_48->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_48->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_05;
      }
    }
    if ((local_98.ss != (StringStorage *)0x0) && (local_98.isTemp == false)) {
      plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_98.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_06;
      }
      local_98.ss = (StringStorage *)0x0;
    }
    if ((local_68 != (long *)0x0) && (local_60.tempNum._0_1_ == '\0')) {
      plVar1 = local_68 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*local_68 + 8))();
        in_RDX = extraout_RDX_07;
      }
    }
    if (*(char *)((long)&vm->standardOutput + 1) != '\x01') goto LAB_00184cf6;
    pSVar10 = (StringStorage *)operator_new(0x30);
    (pSVar10->super_RefCountedStorage).refCount = 1;
    (pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001bf0d8;
    pSVar10->dataSize = 2;
    pSVar10->charCount = -1;
    pcVar4 = (char *)operator_new__(2);
    pSVar10->data = pcVar4;
    pcVar4[0] = '@';
    pcVar4[1] = '\0';
    pSVar3 = (StringStorage *)(local_a0->super_RefCountedStorage)._vptr_RefCountedStorage;
    if (pSVar3 == (StringStorage *)0x0) {
      (pSVar10->super_RefCountedStorage).refCount = 2;
      local_b0.ss = pSVar10;
    }
    else {
      pSVar5 = (StringStorage *)pSVar3->dataSize;
      pSVar11 = (StringStorage *)operator_new(0x30);
      puVar14 = (undefined1 *)((long)&(pSVar5->super_RefCountedStorage)._vptr_RefCountedStorage + 1)
      ;
      (pSVar11->super_RefCountedStorage).refCount = 1;
      (pSVar11->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001bf0d8;
      pSVar11->dataSize = (size_t)puVar14;
      pSVar11->charCount = -1;
      local_88 = pSVar5;
      pcVar12 = (char *)operator_new__((ulong)puVar14);
      pSVar11->data = pcVar12;
      memset(pcVar12,0,(size_t)puVar14);
      *pcVar12 = *pcVar4;
      memcpy(pcVar12 + 1,pSVar3->data,(size_t)local_88);
      local_b0.ss = pSVar11;
    }
    this = (Value *)local_a0;
    local_b0.isTemp = false;
    String::operator=((String *)local_a0,&local_b0);
    in_RDX = extraout_RDX_08;
    if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
      plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_09;
      }
      local_b0.ss = (StringStorage *)0x0;
    }
    plVar1 = &(pSVar10->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 != 0) goto LAB_00184cf6;
    pp_Var13 = (pSVar10->super_RefCountedStorage)._vptr_RefCountedStorage;
    goto LAB_00184cf3;
  case 9:
    *(undefined1 *)&this->data = 0;
    puVar6 = (undefined8 *)operator_new(0x30);
    puVar6[1] = 1;
    *puVar6 = &PTR__StringStorage_001bf0d8;
    puVar6[3] = 7;
    puVar6[4] = 0xffffffffffffffff;
    puVar7 = (undefined4 *)operator_new__(7);
    puVar6[2] = puVar7;
    *(undefined8 **)this = puVar6;
    *(undefined4 *)((long)puVar7 + 3) = 0x656c64;
    *puVar7 = 0x646e6148;
    in_RDX = extraout_RDX_01;
    goto LAB_00184cf6;
  default:
    this->type = Null;
    this->noInvoke = false;
    this->localOnly = Off;
    *(undefined5 *)&this->field_0x3 = 0;
LAB_00184959:
    *(undefined1 *)&this->data = 0;
    goto LAB_00184cf6;
  }
  if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
    plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      pp_Var13 = ((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage;
      pSVar10 = local_b0.ss;
LAB_00184cf3:
      (*pp_Var13[1])(pSVar10);
      in_RDX = extraout_RDX_10;
    }
  }
LAB_00184cf6:
  SVar21._8_8_ = in_RDX;
  SVar21.ss = (StringStorage *)this;
  return SVar21;
}

Assistant:

String Value::ToString(Machine *vm) {
		if (type == ValueType::Number) {
			// Convert number to string in the standard Miniscript way.
			double value = data.number;
			if (fmod(value, 1.0) == 0.0) {
				return String::Format(value, "%.0f");
			} else if (value > 1E10 || value < -1E10 || (value < 1E-6 && value > -1E-6)) {
				// very large/small numbers in exponential form
				return String::Format(value, "%.6E");
			} else {
				// all others in decimal form, with 1-6 digits past the decimal point
				String s = String::Format(value, "%.6f");
				long i = s.LengthB() - 1;
				while (i > 1 && s[i] == '0' && s[i-1] != '.') i--;
				if (i+1 < s.LengthB()) s = s.SubstringB(0, i+1);
				return s;
			}
		}
		if (type == ValueType::String) { retain(); return String((StringStorage*)data.ref, false); }
		if (type == ValueType::List) return CodeForm(vm, 3);
		if (type == ValueType::Map) return CodeForm(vm, 3);
		if (type == ValueType::Var) {
			retain();
			String ident((StringStorage*)data.ref, false);
			if (noInvoke) return String("@") + ident;
			return ident;
		}
		if (type == ValueType::Temp) return String("_") + String::Format((int)data.tempNum);
		if (type == ValueType::Function) {
			String s("FUNCTION(");
			FunctionStorage *fs = (FunctionStorage*)data.ref;
			for (long i=0; i < fs->parameters.Count(); i++) {
				if (i > 0) s += ", ";
				s += fs->parameters[i].name;
				if (not fs->parameters[i].defaultValue.IsNull()) s += String("=") + fs->parameters[i].defaultValue.CodeForm(vm);
			}
			return s + ")";
		}
		if (type == ValueType::SeqElem) {
			SeqElemStorage *se = (SeqElemStorage*)data.ref;
			String s = se->sequence.ToString(vm) + "[" + se->index.ToString(vm) + "]";
			if (noInvoke) s = String("@") + s;
			return s;
		}
		if (type == ValueType::Handle) {
			return "Handle";
		}
		return String();
	}